

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.h
# Opt level: O0

void __thiscall
CVmObjTable::gc_set_init_conditions(CVmObjTable *this,vm_obj_id_t id,CVmObjPageEntry *entry)

{
  CVmObjPageEntry *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjTable *in_RDI;
  
  *(ushort *)&in_RDX->field_0x14 = *(ushort *)&in_RDX->field_0x14 & 0xfff3;
  if ((*(ushort *)&in_RDX->field_0x14 >> 1 & 1) != 0) {
    add_to_gc_queue(in_RDI,in_ESI,in_RDX,2);
  }
  return;
}

Assistant:

void gc_set_init_conditions(vm_obj_id_t id,
                                struct CVmObjPageEntry *entry)
    {
        /* 
         *   Mark the object as unreachable -- at the start of each GC pass,
         *   all non-root-set objects must be marked unreachable.  (It
         *   doesn't matter how we mark root set objects, so we simply mark
         *   everything as reachable to avoid an unnecessary test.)  
         */
        entry->reachable_ = VMOBJ_UNREACHABLE;

        /* 
         *   If it's in the root set, add it to the GC work queue -- all
         *   root-set objects must be in the work queue and marked as
         *   reachable at the start of each GC pass.
         */
        if (entry->in_root_set_)
            add_to_gc_queue(id, entry, VMOBJ_REACHABLE);
    }